

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void quantize_ord_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                        int num_rows)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  _func_void_j_decompress_ptr *p_Var5;
  long lVar6;
  JSAMPROW pJVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  
  if (0 < num_rows) {
    iVar1 = cinfo->out_color_components;
    uVar2 = cinfo->output_width;
    pjVar4 = cinfo->cquantize;
    uVar9 = 0;
    do {
      jzero_far(output_buf[uVar9],(ulong)uVar2);
      iVar3 = *(int *)((long)&pjVar4[2].color_quantize + 4);
      if (0 < iVar1) {
        lVar8 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            p_Var5 = (&pjVar4[2].finish_pass)[lVar8];
            lVar6 = *(long *)(pjVar4[1].finish_pass + lVar8 * 8);
            pJVar7 = output_buf[uVar9];
            pbVar10 = input_buf[uVar9] + lVar8;
            lVar11 = 0;
            uVar12 = 0;
            do {
              pJVar7[lVar11] =
                   pJVar7[lVar11] +
                   *(char *)(lVar6 + (long)*(int *)(p_Var5 + uVar12 * 4 + (long)iVar3 * 0x40) +
                                     (ulong)*pbVar10);
              pbVar10 = pbVar10 + iVar1;
              uVar12 = (ulong)((int)uVar12 + 1U & 0xf);
              lVar11 = lVar11 + 1;
            } while (uVar2 != (uint)lVar11);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != iVar1);
      }
      *(uint *)((long)&pjVar4[2].color_quantize + 4) = iVar3 + 1U & 0xf;
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_ord_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                    JSAMPARRAY output_buf, int num_rows)
/* General case, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  int *dither;                  /* points to active row of dither matrix */
  int row_index, col_index;     /* current indexes into dither matrix */
  int nc = cinfo->out_color_components;
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    jzero_far((void *)output_buf[row], (size_t)(width * sizeof(JSAMPLE)));
    row_index = cquantize->row_index;
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      colorindex_ci = cquantize->colorindex[ci];
      dither = cquantize->odither[ci][row_index];
      col_index = 0;

      for (col = width; col > 0; col--) {
        /* Form pixel value + dither, range-limit to 0..MAXJSAMPLE,
         * select output value, accumulate into output code for this pixel.
         * Range-limiting need not be done explicitly, as we have extended
         * the colorindex table to produce the right answers for out-of-range
         * inputs.  The maximum dither is +- MAXJSAMPLE; this sets the
         * required amount of padding.
         */
        *output_ptr +=
          colorindex_ci[*input_ptr + dither[col_index]];
        input_ptr += nc;
        output_ptr++;
        col_index = (col_index + 1) & ODITHER_MASK;
      }
    }
    /* Advance row index for next row */
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}